

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O1

void __thiscall fmp4_stream::emsg::print(emsg *this)

{
  char cVar1;
  uint8_t *ptr;
  long lVar2;
  ostream *poVar3;
  uint size;
  sc35_splice_info l_splice;
  sc35_splice_info sStack_58;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"=================emsg==================",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," e-msg box version: ",0x14);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," scheme_id_uri:     ",0x14);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->scheme_id_uri_)._M_dataplus._M_p,
                      (this->scheme_id_uri_)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," value:             ",0x14);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(this->value_)._M_dataplus._M_p,
                      (this->value_)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," timescale:         ",0x14);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar2 = std::cout;
  cVar1 = (this->super_full_box).super_box.field_0x62;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  if (cVar1 == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," presentation_time: ",0x14);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout," presentation_time_delta: ",0x1a);
  }
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," event duration:    ",0x14);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," event id           ",0x14);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  lVar2 = std::cout;
  *(undefined8 *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) = 0x21;
  *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x20;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," message data size  ",0x14);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  ptr = (this->message_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start;
  if (*ptr == 0xfc) {
    sc35_splice_info::parse(&sStack_58,ptr,size);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"=============splice info==============",0x26);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '0');
    std::ostream::put('0');
    std::ostream::flush();
    sc35_splice_info::print(&sStack_58,false);
  }
  return;
}

Assistant:

void emsg::print() const
	{
		std::cout << "=================emsg==================" << std::endl;
		std::cout << std::setw(33) << std::left << " e-msg box version: " << (unsigned int)version_ << std::endl;
		std::cout << " scheme_id_uri:     " << scheme_id_uri_ << std::endl;
		std::cout << std::setw(33) << std::left << " value:             " << value_ << std::endl;
		std::cout << std::setw(33) << std::left << " timescale:         " << timescale_ << std::endl;
		if (version_ == 1)
			std::cout << std::setw(33) << std::left << " presentation_time: " << presentation_time_ << std::endl;
		else
			std::cout << std::setw(33) << std::left << " presentation_time_delta: " << presentation_time_delta_ << std::endl;
		std::cout << std::setw(33) << std::left << " event duration:    " << event_duration_ << std::endl;
		std::cout << std::setw(33) << std::left << " event id           " << id_ << std::endl;
		std::cout << std::setw(33) << std::left << " message data size  " << message_data_.size() << std::endl;

		//print_payload

		if (message_data_[0] == 0xFC)
		{
			// splice table
			//cout << " scte splice info" << endl;
			sc35_splice_info l_splice;
			l_splice.parse((uint8_t*)&message_data_[0], (unsigned int)message_data_.size());
			std::cout << "=============splice info==============" << std::endl;
			l_splice.print();
		}
	}